

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sockets.cpp
# Opt level: O0

uint32_t getIpv4(string *addr)

{
  uint32_t uVar1;
  char *__name;
  runtime_error *this;
  in_addr_t value;
  string local_40 [36];
  int local_1c;
  addrinfo *paStack_18;
  int status;
  addrinfo *res;
  string *addr_local;
  
  res = (addrinfo *)addr;
  InitSocketLibrary();
  __name = (char *)std::__cxx11::string::c_str();
  local_1c = getaddrinfo(__name,(char *)0x0,(addrinfo *)&addrinfo,&stack0xffffffffffffffe8);
  if (local_1c != 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "Invalid IPv4 address or unknown hostname: ");
    std::runtime_error::runtime_error(this,local_40);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = *(uint32_t *)(paStack_18->ai_addr->sa_data + 2);
  freeaddrinfo(paStack_18);
  uVar1 = ntohl(uVar1);
  return uVar1;
}

Assistant:

uint32_t getIpv4(const std::string& addr)
{
    struct addrinfo* res;

    InitSocketLibrary();
    const auto status = getaddrinfo(addr.c_str(), nullptr, &addrinfo, &res);
    if (status) {
        throw std::runtime_error("Invalid IPv4 address or unknown hostname: " + addr);
    }

    const auto value = ((struct sockaddr_in*)res->ai_addr)->sin_addr.s_addr;
    freeaddrinfo(res);
    WSACleanup();
    return ntohl(value);
}